

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

int nite::translateKey(string *key)

{
  int iVar1;
  uint uVar2;
  string local_38;
  
  toUpper(&local_38,key);
  std::__cxx11::string::operator=((string *)key,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)key);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)key);
      if (iVar1 == 0) {
        uVar2 = 2;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)key);
        if (iVar1 == 0) {
          uVar2 = 3;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)key);
          if (iVar1 == 0) {
            uVar2 = 4;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)key);
            if (iVar1 == 0) {
              uVar2 = 5;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)key);
              if (iVar1 == 0) {
                uVar2 = 6;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)key);
                if (iVar1 == 0) {
                  uVar2 = 7;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)key);
                  if (iVar1 == 0) {
                    uVar2 = 8;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)key);
                    if (iVar1 == 0) {
                      uVar2 = 9;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)key);
                      if (iVar1 == 0) {
                        uVar2 = 10;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)key);
                        if (iVar1 == 0) {
                          uVar2 = 0xb;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)key);
                          if (iVar1 == 0) {
                            uVar2 = 0xc;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)key);
                            if (iVar1 == 0) {
                              uVar2 = 0xd;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)key);
                              if (iVar1 == 0) {
                                uVar2 = 0xe;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)key);
                                if (iVar1 == 0) {
                                  uVar2 = 0xf;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)key);
                                  if (iVar1 == 0) {
                                    uVar2 = 0x10;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)key);
                                    if (iVar1 == 0) {
                                      uVar2 = 0x11;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)key);
                                      if (iVar1 == 0) {
                                        uVar2 = 0x12;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)key);
                                        if (iVar1 == 0) {
                                          uVar2 = 0x13;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)key);
                                          if (iVar1 == 0) {
                                            uVar2 = 0x14;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)key);
                                            if (iVar1 == 0) {
                                              uVar2 = 0x15;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)key);
                                              if (iVar1 == 0) {
                                                uVar2 = 0x16;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare((char *)key);
                                                if (iVar1 == 0) {
                                                  uVar2 = 0x17;
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare((char *)key)
                                                  ;
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x18;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x19;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x1a;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x1b;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x1c;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x1d;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x1e;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x1f;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x20;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x21;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x22;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x23;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x24;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x25;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x26;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x27;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x28;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x29;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x2a;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x2b;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x2c;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x2d;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x2e;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x2f;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x30;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x31;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x32;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x33;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x34;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x35;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x36;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x37;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x38;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x39;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x3a;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x3b;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x3d;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x3e;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x3f;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x40;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x41;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x42;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x43;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x44;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x45;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x46;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x47;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x48;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x49;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x4a;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x4b;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x4c;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x4d;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x4e;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x4f;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x50;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x51;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x52;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x53;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x54;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x55;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              if (iVar1 == 0) {
                                                                uVar2 = 0x56;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 == 0) {
                                                                  uVar2 = 0x57;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 0x58;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 0x59;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0x5a;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  if (iVar1 == 0) {
                                                    uVar2 = 0x5b;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)key);
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x5c;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)key);
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x5d;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)key);
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x5e;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)key);
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x5f;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)key);
                                                            if (iVar1 == 0) {
                                                              uVar2 = 0x60;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)key);
                                                              uVar2 = 0x62;
                                                              if (iVar1 != 0) {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)key);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)key);
                                                                  if (iVar1 == 0) {
                                                                    uVar2 = 99;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)key);
                                                                    if (iVar1 == 0) {
                                                                      uVar2 = 100;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)key);
                                                                      if (iVar1 == 0) {
                                                                        uVar2 = 0xc9;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)
                                                  key);
                                                  uVar2 = -(uint)(iVar1 != 0) | 0xcb;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int nite::translateKey(String key){
	key = nite::toUpper(key);
	if(key == "A"){return nite::keyA;} else if(key == "B"){return nite::keyB;} else if(key == "C"){return nite::keyC;} else if(key == "D"){return nite::keyD;} else if(key == "E"){return nite::keyE;} else
	if(key == "F"){return nite::keyF;} else if(key == "G"){return nite::keyG;} else if(key == "H"){return nite::keyH;} else if(key == "I"){return nite::keyI;} else if(key == "J"){return nite::keyJ;} else
	if(key == "K"){return nite::keyK;} else if(key == "L"){return nite::keyL;} else if(key == "M"){return nite::keyM;} else if(key == "N"){return nite::keyN;} else if(key == "O"){return nite::keyO;} else
	if(key == "P"){return nite::keyP;} else if(key == "Q"){return nite::keyQ;} else if(key == "R"){return nite::keyR;} else if(key == "S"){return nite::keyS;} else if(key == "T"){return nite::keyT;} else
	if(key == "U"){return nite::keyU;} else if(key == "V"){return nite::keyV;} else if(key == "W"){return nite::keyW;} else if(key == "X"){return nite::keyX;} else if(key == "Y"){return nite::keyY;} else
	if(key == "Z"){return nite::keyZ;} else if(key == "0"){return nite::key0;} else if(key == "1"){return nite::key1;} else if(key == "2"){return nite::key2;} else if(key == "3"){return nite::key3;} else
	if(key == "4"){return nite::key4;} else if(key == "5"){return nite::key5;} else if(key == "6"){return nite::key6;} else if(key == "7"){return nite::key7;} else if(key == "8"){return nite::key8;} else
	if(key == "9"){return nite::key9;} else if(key == "ESCAPE"){return nite::keyESCAPE;} else if(key == "LCONTROL"){return nite::keyLCONTROL;} else if(key == "LSHIFT"){return nite::keyLSHIFT;} else
	if(key == "LALT"){return nite::keyLALT;} else if(key == "LSYSTEM"){return nite::keyLSYSTEM;} else if(key == "RCONTROL"){return nite::keyRCONTROL;} else if(key == "RSHIFT"){return nite::keyRSHIFT;} else
	if(key == "RALT"){return nite::keyRALT;} else if(key == "RSYSTEM"){return nite::keyRSYSTEM;} else if(key == "MENU"){return nite::keyMENU;} else if(key == "LBRACKET"){return nite::keyLBRACKET;} else
	if(key == "RBRACKET"){return nite::keyRBRACKET;} else if(key == "SEMICOLON"){return nite::keySEMICOLON;} else if(key == "COMMA"){return nite::keyCOMMA;} else if(key == "PERIOD"){return nite::keyPERIOD;} else
	if(key == "QUOTE"){return nite::keyQUOTE;} else if(key == "SLASH"){return nite::keySLASH;} else if(key == "BACKSLASH"){return nite::keyBACKSLASH;} else if(key == "TILDE"){return nite::keyTILDE;} else
	if(key == "EQUAL"){return nite::keyEQUAL;} else if(key == "DASH"){return nite::keyDASH;} else if(key == "SPACE"){return nite::keySPACE;} else if(key == "ENTER"){return nite::keyENTER;} else
	if(key == "BACK"){return nite::keyBACK;} else if(key == "PAGEUP"){return nite::keyPAGEUP;} else if(key == "PAGEDOWN"){return nite::keyPAGEDOWN;} else if(key == "END"){return nite::keyEND;} else
	if(key == "HOME"){return nite::keyHOME;} else if(key == "INSERT"){return nite::keyINSERT;} else if(key == "DELETE"){return nite::keyDELETE;} else if(key == "ADD"){return nite::keyADD;} else
	if(key == "SUBTRACT"){return nite::keySUBTRACT;} else if(key == "MULTIPLY"){return nite::keyMULTIPLY;} else if(key == "DIVIDE"){return nite::keyDIVIDE;} else if(key == "LEFT"){return nite::keyLEFT;} else
	if(key == "RIGHT"){return nite::keyRIGHT;} else if(key == "UP"){return nite::keyUP;} else if(key == "DOWN"){return nite::keyDOWN;} else if(key == "NUMPAD0"){return nite::keyNUMPAD0;} else
	if(key == "NUMPAD1"){return nite::keyNUMPAD1;} else if(key == "NUMPAD2"){return nite::keyNUMPAD2;} else if(key == "NUMPAD3"){return nite::keyNUMPAD3;} else if(key == "NUMPAD4"){return nite::keyNUMPAD4;} else
	if(key == "NUMPAD5"){return nite::keyNUMPAD5;} else if(key == "NUMPAD6"){return nite::keyNUMPAD6;} else if(key == "NUMPAD7"){return nite::keyNUMPAD7;} else if(key == "NUMPAD8"){return nite::keyNUMPAD8;} else
	if(key == "NUMPAD9"){return nite::keyNUMPAD9;} else if(key == "F1"){return nite::keyF1;} else if(key == "F2"){return nite::keyF2;} else if(key == "F3"){return nite::keyF3;} else if(key == "F4"){return nite::keyF4;} else
	if(key == "F5"){return nite::keyF5;} else if(key == "F6"){return nite::keyF6;} else if(key == "F7"){return nite::keyF7;} else if(key == "F8"){return nite::keyF8;} else if(key == "F9"){return nite::keyF9;} else
	if(key == "F10"){return nite::keyF10;} else if(key == "F11"){return nite::keyF11;} else if(key == "F12"){return nite::keyF12;} else if(key == "F14"){return nite::keyF14;} else if(key == "F14"){return nite::keyF14;} else
	if(key == "F15"){return nite::keyF15;} else if(key == "PAUSE"){return nite::keyPAUSE;}else
	if(key == "M1"){ return nite::butLEFT; } else if(key == "M2"){ return nite::butRIGHT; } else
	return -1;
}